

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_CutFilter(If_Set_t *pCutSet,If_Cut_t *pCut,int fSaveCut0)

{
  If_Cut_t *pDom;
  int iVar1;
  int local_38;
  int local_34;
  int k;
  int i;
  If_Cut_t *pTemp;
  int fSaveCut0_local;
  If_Cut_t *pCut_local;
  If_Set_t *pCutSet_local;
  
  if (pCutSet->ppCuts[pCutSet->nCuts] != pCut) {
    __assert_fail("pCutSet->ppCuts[pCutSet->nCuts] == pCut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifCut.c"
                  ,0x96,"int If_CutFilter(If_Set_t *, If_Cut_t *, int)");
  }
  local_34 = 0;
  do {
    if (pCutSet->nCuts <= local_34) {
      return 0;
    }
    pDom = pCutSet->ppCuts[local_34];
    if (*(uint *)&pCut->field_0x1c >> 0x18 < *(uint *)&pDom->field_0x1c >> 0x18) {
      if (((local_34 != 0) ||
          (((pCutSet->nCuts < 2 || ((*(uint *)&pCutSet->ppCuts[1]->field_0x1c >> 0xe & 1) == 0)) &&
           ((fSaveCut0 == 0 || (pCutSet->nCuts != 1)))))) &&
         (((pDom->uSign & pCut->uSign) == pCut->uSign &&
          (iVar1 = If_CutCheckDominance(pCut,pDom), iVar1 != 0)))) {
        for (local_38 = local_34; local_38 < pCutSet->nCuts; local_38 = local_38 + 1) {
          pCutSet->ppCuts[local_38] = pCutSet->ppCuts[local_38 + 1];
        }
        pCutSet->ppCuts[pCutSet->nCuts] = pDom;
        pCutSet->nCuts = pCutSet->nCuts + -1;
        local_34 = local_34 + -1;
      }
    }
    else if (((pDom->uSign & pCut->uSign) == pDom->uSign) &&
            (iVar1 = If_CutCheckDominance(pDom,pCut), iVar1 != 0)) {
      return 1;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

int If_CutFilter( If_Set_t * pCutSet, If_Cut_t * pCut, int fSaveCut0 )
{ 
    If_Cut_t * pTemp;
    int i, k;
    assert( pCutSet->ppCuts[pCutSet->nCuts] == pCut );
    for ( i = 0; i < pCutSet->nCuts; i++ )
    {
        pTemp = pCutSet->ppCuts[i];
        if ( pTemp->nLeaves > pCut->nLeaves )
        {
            // do not fiter the first cut
            if ( i == 0 && ((pCutSet->nCuts > 1 && pCutSet->ppCuts[1]->fUseless) || (fSaveCut0 && pCutSet->nCuts == 1)) )
                continue;
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pCut->uSign )
                continue;
            // check containment seriously
            if ( If_CutCheckDominance( pCut, pTemp ) )
            {
//                p->ppCuts[i] = p->ppCuts[p->nCuts-1];
//                p->ppCuts[p->nCuts-1] = pTemp;
//                p->nCuts--;
//                i--;
                // remove contained cut
                for ( k = i; k < pCutSet->nCuts; k++ )
                    pCutSet->ppCuts[k] = pCutSet->ppCuts[k+1];
                pCutSet->ppCuts[pCutSet->nCuts] = pTemp;
                pCutSet->nCuts--;
                i--;
            }
         }
        else
        {
            // skip the non-contained cuts
            if ( (pTemp->uSign & pCut->uSign) != pTemp->uSign )
                continue;
            // check containment seriously
            if ( If_CutCheckDominance( pTemp, pCut ) )
                return 1;
        }
    }
    return 0;
}